

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

void __thiscall crnlib::crn_comp::optimize_color(crn_comp *this)

{
  uint8 uVar1;
  ushort uVar2;
  uint uVar3;
  endpoint_indices_details *peVar4;
  undefined4 uVar5;
  ushort uVar6;
  uint b;
  ulong uVar7;
  optimize_color_params *poVar8;
  uint uVar9;
  undefined4 uVar10;
  uint8 uVar11;
  uint i_1;
  void *pData_ptr;
  long lVar12;
  float *pfVar13;
  uint size;
  result *this_00;
  bool bVar14;
  vector<crnlib::optimize_color_params::unpacked_endpoint> unpacked_endpoints;
  vector<unsigned_int> sum;
  vector<unsigned_int> hist;
  result remapping_trial [4];
  
  uVar9 = (this->m_color_endpoints).m_size;
  uVar6 = (ushort)uVar9;
  vector<unsigned_int>::vector(&hist,(uVar9 & 0xffff) * (uVar9 & 0xffff));
  size = uVar9 & 0xffff;
  vector<unsigned_int>::vector(&sum,uVar9 & 0xffff);
  uVar9 = 0;
  for (uVar7 = 0; uVar7 < (this->m_endpoint_indices).m_size; uVar7 = uVar7 + 1) {
    peVar4 = (this->m_endpoint_indices).m_p;
    uVar2 = peVar4[uVar7].field_0.field_0.color;
    uVar1 = peVar4[uVar7].reference;
    uVar11 = uVar1;
    if (this->m_has_subblocks == false) {
      uVar11 = uVar1 == '\0';
    }
    if ((uVar7 & 1) == 0) {
      uVar11 = uVar1 == '\0';
    }
    if ((uVar11 != '\0') && (uVar9 != uVar2)) {
      hist.m_p[size * uVar2 + uVar9] = hist.m_p[size * uVar2 + uVar9] + 1;
      hist.m_p[uVar9 * size + (uint)uVar2] = hist.m_p[uVar9 * size + (uint)uVar2] + 1;
      sum.m_p[uVar2] = sum.m_p[uVar2] + 1;
      sum.m_p[uVar9] = sum.m_p[uVar9] + 1;
    }
    uVar9 = (uint)uVar2;
  }
  uVar10 = 0;
  uVar9 = 0;
  for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    uVar3 = sum.m_p[uVar7];
    bVar14 = uVar3 <= uVar9;
    if (!bVar14 || uVar9 == uVar3) {
      uVar9 = uVar3;
    }
    uVar5 = (int)uVar7;
    if (bVar14) {
      uVar5 = uVar10;
    }
    uVar10 = uVar5;
  }
  vector<crnlib::optimize_color_params::unpacked_endpoint>::vector(&unpacked_endpoints,size);
  this_00 = remapping_trial;
  for (lVar12 = 0; (ushort)lVar12 < uVar6; lVar12 = lVar12 + 1) {
    uVar9 = (this->m_color_endpoints).m_p[lVar12];
    if (this->m_has_etc_color_blocks == true) {
      uVar9 = uVar9 & 0xffffff;
    }
    else {
      dxt1_block::unpack_color((dxt1_block *)this_00,(uint16)uVar9,true,0xff);
      uVar9 = (uint)remapping_trial[0].endpoint_remapping.m_p;
    }
    unpacked_endpoints.m_p[lVar12].low.field_0.m_u32 = uVar9;
    uVar9 = (this->m_color_endpoints).m_p[lVar12];
    if (this->m_has_etc_color_blocks == true) {
      uVar9 = uVar9 >> 0x18;
    }
    else {
      dxt1_block::unpack_color((dxt1_block *)this_00,(uint16)(uVar9 >> 0x10),true,0xff);
      uVar9 = (uint)remapping_trial[0].endpoint_remapping.m_p;
    }
    unpacked_endpoints.m_p[lVar12].high.field_0.m_u32 = uVar9;
  }
  remapping_trial[0].packed_endpoints.m_p = (uchar *)0x0;
  remapping_trial[0].packed_endpoints.m_size = 0;
  remapping_trial[0].packed_endpoints.m_capacity = 0;
  remapping_trial[0].endpoint_remapping.m_p = (unsigned_short *)0x0;
  remapping_trial[0].endpoint_remapping.m_size = 0;
  remapping_trial[0].endpoint_remapping.m_capacity = 0;
  remapping_trial[1].endpoint_remapping.m_p = (unsigned_short *)0x0;
  remapping_trial[1].endpoint_remapping.m_size = 0;
  remapping_trial[1].endpoint_remapping.m_capacity = 0;
  remapping_trial[1].packed_endpoints.m_p = (uchar *)0x0;
  remapping_trial[1].packed_endpoints.m_size = 0;
  remapping_trial[1].packed_endpoints.m_capacity = 0;
  remapping_trial[2].endpoint_remapping.m_p = (unsigned_short *)0x0;
  remapping_trial[2].endpoint_remapping.m_size = 0;
  remapping_trial[2].endpoint_remapping.m_capacity = 0;
  remapping_trial[2].packed_endpoints.m_p = (uchar *)0x0;
  remapping_trial[2].packed_endpoints.m_size = 0;
  remapping_trial[2].packed_endpoints.m_capacity = 0;
  remapping_trial[3].endpoint_remapping.m_p = (unsigned_short *)0x0;
  remapping_trial[3].endpoint_remapping.m_size = 0;
  remapping_trial[3].endpoint_remapping.m_capacity = 0;
  remapping_trial[3].packed_endpoints.m_p = (uchar *)0x0;
  remapping_trial[3].packed_endpoints.m_size = 0;
  remapping_trial[3].packed_endpoints.m_capacity = 0;
  pfVar13 = (float *)&DAT_00195180;
  for (pData_ptr = (void *)0x0; pData_ptr != (void *)0x4; pData_ptr = (void *)((long)pData_ptr + 1))
  {
    poVar8 = crnlib_new<crnlib::optimize_color_params>();
    poVar8->unpacked_endpoints = unpacked_endpoints.m_p;
    poVar8->hist = hist.m_p;
    poVar8->n = uVar6;
    poVar8->selected = (uint16)uVar10;
    poVar8->weight = *pfVar13;
    poVar8->pResult = this_00;
    task_pool::
    queue_object_task<crnlib::crn_comp,void(crnlib::crn_comp::*)(unsigned_long_long,void*)>
              (&this->m_task_pool,this,0x159c2e,0,pData_ptr);
    pfVar13 = pfVar13 + 1;
    this_00 = this_00 + 1;
  }
  task_pool::join(&this->m_task_pool);
  uVar9 = 0xffffffff;
  for (lVar12 = 0; lVar12 != 0xa0; lVar12 = lVar12 + 0x28) {
    if (*(uint *)((long)&remapping_trial[0].total_bits + lVar12) < uVar9) {
      vector<unsigned_char>::swap
                (&this->m_packed_color_endpoints,
                 (vector<unsigned_char> *)((long)&remapping_trial[0].packed_endpoints.m_p + lVar12))
      ;
      vector<unsigned_short>::swap
                (this->m_endpoint_remaping,
                 (vector<unsigned_short> *)
                 ((long)&remapping_trial[0].endpoint_remapping.m_p + lVar12));
      uVar9 = *(uint *)((long)&remapping_trial[0].total_bits + lVar12);
    }
  }
  lVar12 = 0x78;
  do {
    optimize_color_params::result::~result
              ((result *)((long)&remapping_trial[0].endpoint_remapping.m_p + lVar12));
    lVar12 = lVar12 + -0x28;
  } while (lVar12 != -0x28);
  vector<crnlib::optimize_color_params::unpacked_endpoint>::~vector(&unpacked_endpoints);
  vector<unsigned_int>::~vector(&sum);
  vector<unsigned_int>::~vector(&hist);
  return;
}

Assistant:

void crn_comp::optimize_color() {
  uint16 n = m_color_endpoints.size();
  crnlib::vector<uint> hist(n * n);
  crnlib::vector<uint> sum(n);
  for (uint i, i_prev = 0, b = 0; b < m_endpoint_indices.size(); b++, i_prev = i) {
    i = m_endpoint_indices[b].color;
    if ((m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : !m_endpoint_indices[b].reference) && i != i_prev) {
      hist[i * n + i_prev]++;
      hist[i_prev * n + i]++;
      sum[i]++;
      sum[i_prev]++;
    }
  }
  uint16 selected = 0;
  uint best_sum = 0;
  for (uint16 i = 0; i < n; i++) {
    if (best_sum < sum[i]) {
      best_sum = sum[i];
      selected = i;
    }
  }
  crnlib::vector<optimize_color_params::unpacked_endpoint> unpacked_endpoints(n);
  for (uint16 i = 0; i < n; i++) {
    unpacked_endpoints[i].low.m_u32 = m_has_etc_color_blocks ? m_color_endpoints[i] & 0xFFFFFF : dxt1_block::unpack_color(m_color_endpoints[i] & 0xFFFF, true).m_u32;
    unpacked_endpoints[i].high.m_u32 = m_has_etc_color_blocks ? m_color_endpoints[i] >> 24 : dxt1_block::unpack_color(m_color_endpoints[i] >> 16, true).m_u32;
  }

  optimize_color_params::result remapping_trial[4];
  float weights[4] = {0, 0, 1.0f / 6.0f, 0.5f};
  for (uint i = 0; i < 4; i++) {
    optimize_color_params* pParams = crnlib_new<optimize_color_params>();
    pParams->unpacked_endpoints = unpacked_endpoints.get_ptr();
    pParams->hist = hist.get_ptr();
    pParams->n = n;
    pParams->selected = selected;
    pParams->weight = weights[i];
    pParams->pResult = remapping_trial + i;
    m_task_pool.queue_object_task(this, &crn_comp::optimize_color_endpoints_task, i, pParams);
  }
  m_task_pool.join();

  for (uint best_bits = cUINT32_MAX, i = 0; i < 4; i++) {
    if (remapping_trial[i].total_bits < best_bits) {
      m_packed_color_endpoints.swap(remapping_trial[i].packed_endpoints);
      m_endpoint_remaping[cColor].swap(remapping_trial[i].endpoint_remapping);
      best_bits = remapping_trial[i].total_bits;
    }
  }
}